

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  value_type *in_RDI;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int i_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  float shrink_threshold;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  size_t bucket_count;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  float grow_threshold;
  size_type kSize;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb38;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb40;
  key_equal *in_stack_fffffffffffffb48;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  float in_stack_fffffffffffffb5c;
  float in_stack_fffffffffffffb60;
  float in_stack_fffffffffffffb64;
  float in_stack_fffffffffffffb6c;
  float type;
  AssertHelper *in_stack_fffffffffffffb70;
  float local_450;
  Message *in_stack_fffffffffffffbb8;
  float in_stack_fffffffffffffbc0;
  float in_stack_fffffffffffffbc4;
  float local_404;
  float local_3fc;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc80;
  AssertionResult local_368 [2];
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_348;
  AssertionResult local_340 [6];
  value_type local_2d4;
  key_type local_2cc;
  key_type local_2c8;
  int local_2c4;
  float local_2ac;
  AssertionResult local_2a8 [2];
  float local_284;
  undefined8 local_280;
  AssertionResult local_278;
  float local_264;
  size_type local_250;
  AssertionResult local_248 [2];
  size_type local_228;
  AssertionResult local_220 [6];
  value_type local_1b8;
  int local_1b0;
  key_type local_1ac;
  value_type local_150;
  size_type local_148;
  float local_12c;
  undefined8 local_128;
  AssertionResult local_120 [2];
  float local_fc;
  AssertionResult local_f8;
  key_type local_e8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d8 [12];
  float local_14;
  undefined8 local_10;
  
  local_10 = 0x4098;
  for (local_14 = 0.2; local_14 <= 0.8; local_14 = local_14 + 0.2) {
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffb40,
               (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffb40,
               (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_d8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (hasher *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (allocator_type *)in_stack_fffffffffffffb40);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_d8);
    local_e8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffffb40,(key_type *)in_stack_fffffffffffffb38);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::max_load_factor(in_stack_fffffffffffffb40,(float)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::min_load_factor(in_stack_fffffffffffffb40,(float)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    local_fc = google::
               BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::max_load_factor((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcab025);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (char *)in_stack_fffffffffffffb50,(float *)in_stack_fffffffffffffb48,
               (float *)in_stack_fffffffffffffb40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::AssertionResult::failure_message((AssertionResult *)0xcab0e2);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb70,(Type)in_stack_fffffffffffffb6c,
                 (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (int)in_stack_fffffffffffffb5c,(char *)in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      testing::Message::~Message((Message *)0xcab145);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcab1b6);
    local_128 = 0;
    local_12c = google::
                BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcab1cf);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (char *)in_stack_fffffffffffffb50,(double *)in_stack_fffffffffffffb48,
               (float *)in_stack_fffffffffffffb40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::AssertionResult::failure_message((AssertionResult *)0xcab25f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb70,(Type)in_stack_fffffffffffffb6c,
                 (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (int)in_stack_fffffffffffffb5c,(char *)in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      testing::Message::~Message((Message *)0xcab2c2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcab333);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::resize(in_stack_fffffffffffffb40,(size_type)in_stack_fffffffffffffb38);
    local_148 = google::
                BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcab354);
    local_150 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffb38,0);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffc80,in_RDI);
    local_1ac = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb50,
                            (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffffb40,(key_type *)in_stack_fffffffffffffb38);
    local_1b0 = 2;
    while( true ) {
      local_1b8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(in_stack_fffffffffffffb38,0);
      google::
      BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffc80,in_RDI);
      sVar2 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xcab45e);
      local_3fc = (float)sVar2;
      local_404 = (float)local_148;
      if (local_14 <= local_3fc / local_404) break;
      local_228 = google::
                  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcab549);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (char *)in_stack_fffffffffffffb50,(unsigned_long *)in_stack_fffffffffffffb48,
                 (unsigned_long *)in_stack_fffffffffffffb40);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb70);
        testing::AssertionResult::failure_message((AssertionResult *)0xcab5d6);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb70,(Type)in_stack_fffffffffffffb6c,
                   (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (int)in_stack_fffffffffffffb5c,(char *)in_stack_fffffffffffffb50);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbb8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
        testing::Message::~Message((Message *)0xcab639);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcab6a4);
      local_1b0 = local_1b0 + 1;
    }
    local_250 = google::
                BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcab6c8);
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (char *)in_stack_fffffffffffffb50,(unsigned_long *)in_stack_fffffffffffffb48,
               (unsigned_long *)in_stack_fffffffffffffb40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::AssertionResult::failure_message((AssertionResult *)0xcab743);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb70,(Type)in_stack_fffffffffffffb6c,
                 (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (int)in_stack_fffffffffffffb5c,(char *)in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      testing::Message::~Message((Message *)0xcab7a6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcab811);
    sVar2 = google::
            BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::size((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xcab84a);
    in_stack_fffffffffffffbc0 = (float)(long)sVar2;
    in_stack_fffffffffffffbc4 = (float)sVar2;
    in_stack_fffffffffffffbb8 =
         (Message *)
         google::
         BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0xcab8bd);
    local_450 = (float)in_stack_fffffffffffffbb8;
    local_264 = (float)sVar2 / local_450 + -0.01;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_resizing_parameters
              (in_stack_fffffffffffffb40,(float)((ulong)in_stack_fffffffffffffb38 >> 0x20),
               SUB84(in_stack_fffffffffffffb38,0));
    local_280 = 0x3ff0000000000000;
    local_284 = google::
                BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::max_load_factor((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcab96c);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (char *)in_stack_fffffffffffffb50,(double *)in_stack_fffffffffffffb48,
               (float *)in_stack_fffffffffffffb40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::AssertionResult::failure_message((AssertionResult *)0xcab9e4);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb70,(Type)in_stack_fffffffffffffb6c,
                 (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (int)in_stack_fffffffffffffb5c,(char *)in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      testing::Message::~Message((Message *)0xcaba41);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcabaaf);
    local_2ac = google::
                BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::min_load_factor((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xcababc);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (char *)in_stack_fffffffffffffb50,(float *)in_stack_fffffffffffffb48,
               (float *)in_stack_fffffffffffffb40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      testing::AssertionResult::failure_message((AssertionResult *)0xcabb46);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb70,(Type)in_stack_fffffffffffffb6c,
                 (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (int)in_stack_fffffffffffffb5c,(char *)in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      testing::Message::~Message((Message *)0xcabba3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcabc14);
    local_148 = google::
                BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcabc21);
    local_2c4 = 2;
    while( true ) {
      local_2c8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueKey(in_stack_fffffffffffffb50,
                              (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase(in_stack_fffffffffffffb40,(key_type *)in_stack_fffffffffffffb38);
      local_2cc = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueKey(in_stack_fffffffffffffb50,
                              (int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase(in_stack_fffffffffffffb40,(key_type *)in_stack_fffffffffffffb38);
      local_2d4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(in_stack_fffffffffffffb38,0);
      google::
      BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffc80,in_RDI);
      in_stack_fffffffffffffb70 =
           (AssertHelper *)
           google::
           BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::size((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xcabd10);
      in_stack_fffffffffffffb5c = (float)in_stack_fffffffffffffb70;
      in_stack_fffffffffffffb60 = (float)(long)local_148;
      in_stack_fffffffffffffb64 = (float)local_148;
      if (in_stack_fffffffffffffb5c / in_stack_fffffffffffffb64 <= local_264) break;
      type = in_stack_fffffffffffffb5c;
      in_stack_fffffffffffffb50 =
           (HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xcabdcd);
      local_348 = in_stack_fffffffffffffb50;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (char *)in_stack_fffffffffffffb50,(unsigned_long *)in_stack_fffffffffffffb48,
                 (unsigned_long *)in_stack_fffffffffffffb40);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_340);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb70);
        in_stack_fffffffffffffb48 =
             (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xcabe54);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb70,(Type)type,
                   (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (int)in_stack_fffffffffffffb5c,(char *)in_stack_fffffffffffffb50);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbb8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
        testing::Message::~Message((Message *)0xcabeb1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcabf1c);
      local_2c4 = local_2c4 + 1;
    }
    in_stack_fffffffffffffb6c = in_stack_fffffffffffffb5c;
    in_stack_fffffffffffffb40 =
         (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)google::
            BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcabf40);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (char *)in_stack_fffffffffffffb50,(unsigned_long *)in_stack_fffffffffffffb48,
               (unsigned_long *)in_stack_fffffffffffffb40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb70);
      in_stack_fffffffffffffb38 =
           (HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xcabfb5);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb70,(Type)in_stack_fffffffffffffb6c,
                 (char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (int)in_stack_fffffffffffffb5c,(char *)in_stack_fffffffffffffb50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb40);
      testing::Message::~Message((Message *)0xcac010);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcac07b);
    google::
    HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xcac0b1);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}